

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawrend.cpp
# Opt level: O3

void __thiscall CGL::DrawRend::keyboard_event(DrawRend *this,int key,int event,uchar mods)

{
  PixelSampleMethod PVar1;
  pointer pvVar2;
  pointer pvVar3;
  size_type sVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  pointer pvVar8;
  double dVar9;
  double dVar10;
  double in_XMM0_Qb;
  double extraout_XMM0_Qb;
  double __x;
  vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_> samplebuffer_row
  ;
  allocator_type local_71;
  vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_> local_70;
  undefined1 local_58 [16];
  SampleBuffer local_40;
  
  if (event != 1) {
    return;
  }
  uVar5 = key - 0x31;
  if ((uVar5 < 9) &&
     ((ulong)uVar5 <
      (ulong)((long)(this->svgs).super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)(this->svgs).super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>._M_impl
                    .super__Vector_impl_data._M_start >> 3))) {
    this->current_svg = (ulong)uVar5;
  }
  else if (key < 0x4c) {
    if (key != 0x20) {
      if (key == 0x2d) {
        if (this->sample_rate < 2) {
          return;
        }
        __x = (double)this->sample_rate;
        dVar10 = SQRT(__x);
        dVar9 = (double)(int)(dVar10 + -1.0);
        if (__x < 0.0) {
          local_58._8_8_ = 0;
          local_58._0_8_ = (double)(int)(dVar10 + -1.0);
          dVar10 = sqrt(__x);
          dVar9 = (double)local_58._0_8_;
        }
        iVar6 = (int)((dVar10 + -1.0) * dVar9);
        this->sample_rate = iVar6;
        pvVar2 = (this->samplebuffer).
                 super__Vector_base<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar3 = (this->samplebuffer).
                 super__Vector_base<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pvVar8 = pvVar2;
        if (pvVar3 != pvVar2) {
          do {
            std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>::
            ~vector(pvVar8);
            pvVar8 = pvVar8 + 1;
          } while (pvVar8 != pvVar3);
          (this->samplebuffer).
          super__Vector_base<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
          iVar6 = this->sample_rate;
        }
        dVar9 = (double)iVar6;
        sVar4 = this->width;
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        SampleBuffer::SampleBuffer
                  (&local_40,
                   (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9);
        std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>::
        vector(&local_70,sVar4,&local_40,&local_71);
        std::
        vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
        ::~vector(&local_40.sub_pixels);
        if (this->height != 0) {
          uVar7 = 0;
          do {
            std::
            vector<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
            ::push_back(&this->samplebuffer,&local_70);
            uVar7 = uVar7 + 1;
          } while (uVar7 < this->height);
        }
        redraw(this);
      }
      else {
        if (key != 0x3d) {
          return;
        }
        if (0xf < this->sample_rate) {
          return;
        }
        dVar9 = (double)this->sample_rate;
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
          in_XMM0_Qb = extraout_XMM0_Qb;
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        dVar10 = (double)this->sample_rate;
        if (dVar10 < 0.0) {
          local_58._8_4_ = SUB84((double)(int)in_XMM0_Qb,0);
          local_58._0_8_ = (double)(int)(dVar9 + 1.0);
          local_58._12_4_ = (int)((ulong)(double)(int)in_XMM0_Qb >> 0x20);
          dVar10 = sqrt(dVar10);
          dVar9 = (double)local_58._0_8_;
        }
        else {
          dVar10 = SQRT(dVar10);
          dVar9 = (double)(int)(dVar9 + 1.0);
        }
        iVar6 = (int)((dVar10 + 1.0) * dVar9);
        this->sample_rate = iVar6;
        pvVar2 = (this->samplebuffer).
                 super__Vector_base<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar3 = (this->samplebuffer).
                 super__Vector_base<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pvVar8 = pvVar2;
        if (pvVar3 != pvVar2) {
          do {
            std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>::
            ~vector(pvVar8);
            pvVar8 = pvVar8 + 1;
          } while (pvVar8 != pvVar3);
          (this->samplebuffer).
          super__Vector_base<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
          iVar6 = this->sample_rate;
        }
        dVar9 = (double)iVar6;
        sVar4 = this->width;
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        SampleBuffer::SampleBuffer
                  (&local_40,
                   (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9);
        std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>::
        vector(&local_70,sVar4,&local_40,&local_71);
        std::
        vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
        ::~vector(&local_40.sub_pixels);
        if (this->height != 0) {
          uVar7 = 0;
          do {
            std::
            vector<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
            ::push_back(&this->samplebuffer,&local_70);
            uVar7 = uVar7 + 1;
          } while (uVar7 < this->height);
        }
        redraw(this);
      }
      std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>::
      ~vector(&local_70);
      return;
    }
    view_init(this);
  }
  else {
    if (0x52 < key) {
      if (key != 0x53) {
        if (key == 0x5a) {
          iVar6 = this->show_zoom;
          this->show_zoom = (iVar6 - ((iVar6 - (iVar6 + 1 >> 0x1f)) + 1U & 0xfffffffe)) + 1;
        }
        return;
      }
      write_screenshot(this);
      return;
    }
    if (key == 0x4c) {
      this->lsm = this->lsm + ((int)(this->lsm + L_NEAREST) / 3) * -3 + L_NEAREST;
    }
    else {
      if (key != 0x50) {
        return;
      }
      PVar1 = this->psm;
      this->psm = (PVar1 - ((PVar1 - ((int)(PVar1 + P_LINEAR) >> 0x1f)) + 1 & 0xfffffffe)) +
                  P_LINEAR;
    }
  }
  redraw(this);
  return;
}

Assistant:

void DrawRend::keyboard_event( int key, int event, unsigned char mods ) {
  if (event != EVENT_PRESS)
    return;

  // tab through the loaded files
  if (key >= '1' && key <= '9' && key-'1' < svgs.size()) {
    current_svg = key - '1';
    redraw();
    return;
  }

  switch( key ) {

    // reset view transformation
    case ' ':
      view_init();
      redraw();
      break;

    // set the sampling rate to 1, 4, 9, or 16
    case '=':
      if (sample_rate < 16) {
        sample_rate = (int)(sqrt(sample_rate)+1)*(sqrt(sample_rate)+1);

        samplebuffer.clear();
        vector<SampleBuffer> samplebuffer_row(width, SampleBuffer(sqrt(sample_rate)));
        for (int i = 0; i < height; ++i)
          samplebuffer.push_back(samplebuffer_row);
        redraw();
      }
      break;
    case '-':
      if (sample_rate > 1) {
        sample_rate = (int)(sqrt(sample_rate)-1)*(sqrt(sample_rate)-1);

        samplebuffer.clear();
        vector<SampleBuffer> samplebuffer_row(width, SampleBuffer(sqrt(sample_rate)));
        for (int i = 0; i < height; ++i)
          samplebuffer.push_back(samplebuffer_row);
        redraw();
      }
      break;

    // save the current buffer to disk
    case 'S':
      write_screenshot();
      break;

    // toggle pixel sampling scheme
    case 'P':
      psm = (PixelSampleMethod)((psm+1)%2);
      redraw();
      break;
    // toggle level sampling scheme
    case 'L':
      lsm = (LevelSampleMethod)((lsm+1)%3);
      redraw();
      break;

    // toggle zoom
    case 'Z':
      show_zoom = (show_zoom+1)%2;
      break;

    default:
      return;
  }
}